

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_thread_process.cpp
# Opt level: O1

void __thiscall sc_core::sc_thread_process::~sc_thread_process(sc_thread_process *this)

{
  sc_cor *psVar1;
  pointer ppsVar2;
  
  (this->super_sc_process_b).super_sc_object._vptr_sc_object = (_func_int **)&PTR_print_0026f350;
  psVar1 = this->m_cor_p;
  if (psVar1 != (sc_cor *)0x0) {
    (*psVar1->_vptr_sc_cor[2])(psVar1,0);
    if (this->m_cor_p != (sc_cor *)0x0) {
      (*this->m_cor_p->_vptr_sc_cor[1])();
    }
    this->m_cor_p = (sc_cor *)0x0;
  }
  if ((this->super_sc_process_b).m_dynamic_proc != SPAWN_SIM) {
    sc_simcontext::remove_process((this->super_sc_process_b).super_sc_object.m_simc,this);
  }
  ppsVar2 = (this->m_monitor_q).
            super__Vector_base<sc_core::sc_process_monitor_*,_std::allocator<sc_core::sc_process_monitor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppsVar2 != (pointer)0x0) {
    operator_delete(ppsVar2);
  }
  sc_process_b::~sc_process_b(&this->super_sc_process_b);
  return;
}

Assistant:

sc_thread_process::~sc_thread_process()
{

    // DESTROY THE COROUTINE FOR THIS THREAD:

    if( m_cor_p != 0 ) {
        m_cor_p->stack_protect( false );
        delete m_cor_p;
        m_cor_p = 0;
    }

    // Remove from simcontext, if not spawned during simulation
    if( m_dynamic_proc != SPAWN_SIM ) {
        simcontext()->remove_process(this);
    }
}